

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_list.c
# Opt level: O0

void tester_list_print_log(tester_list_t *list)

{
  tester_list *local_18;
  tester_list_t *iter;
  tester_list_t *list_local;
  
  for (local_18 = list->next; local_18 != (tester_list *)0x0; local_18 = local_18->next) {
    if (local_18->this != (tester_t *)0x0) {
      printf("PID: %d\nRcd: %zu\nAcc: %zu\n",(ulong)(uint)local_18->this->pid,local_18->this->rcd,
             local_18->this->acc);
    }
  }
  return;
}

Assistant:

void tester_list_print_log(const tester_list_t *list) {
    TESTER_LIST_ASSERT_OK;

    tester_list_t *iter = list->next;
    while(iter != NULL) {
        if(iter->this != NULL) {
            printf("PID: %d\nRcd: %zu\nAcc: %zu\n", iter->this->pid, iter->this->rcd, iter->this->acc);
        }
        iter = iter->next;
    }
}